

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O2

bool __thiscall
tf::Executor::_invoke_runtime_task_impl
          (Executor *this,Worker *worker,Node *node,function<void_(tf::Runtime_&)> *work)

{
  Runtime rt;
  Runtime local_48;
  
  if (((uint)node->_nstate >> 0x1d & 1) == 0) {
    local_48._preempted = false;
    local_48._executor = this;
    local_48._worker = worker;
    local_48._parent = node;
    _observer_prologue(this,worker,node);
    std::function<void_(tf::Runtime_&)>::operator()(work,&local_48);
    _observer_epilogue(this,worker,node);
    if (local_48._preempted != false) {
      return true;
    }
  }
  else {
    node->_nstate = node->_nstate & 0xdfffffff;
  }
  return false;
}

Assistant:

inline bool Executor::_invoke_runtime_task_impl(
  Worker& worker, Node* node, std::function<void(Runtime&)>& work
) {
  // first time
  if((node->_nstate & NSTATE::PREEMPTED) == 0) {

    Runtime rt(*this, worker, node);

    _observer_prologue(worker, node);
    TF_EXECUTOR_EXCEPTION_HANDLER(worker, node, {
      work(rt);
    });
    _observer_epilogue(worker, node);
    
    // here, we cannot check the state from node->_nstate due to data race
    if(rt._preempted) {
      return true;
    }
  }
  // second time - previously preempted
  else {
    node->_nstate &= ~NSTATE::PREEMPTED;
  }
  return false;
}